

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O2

void __thiscall
MutableS2ShapeIndex::UpdateEdges
          (MutableS2ShapeIndex *this,S2PaddedCell *pcell,
          vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
          *edges,InteriorTracker *tracker,EdgeAllocator *alloc,bool disjoint_from_index)

{
  undefined8 *puVar1;
  double u;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  CellRelation CVar5;
  R2Rect *pRVar6;
  ClippedEdge *pCVar7;
  ClippedEdge *pCVar8;
  uint j;
  int iVar9;
  Iterator *pIVar10;
  int pos;
  ulong uVar11;
  int i_1;
  ulong uVar12;
  int i;
  long lVar13;
  R1Interval *middle;
  long lVar14;
  bool local_10c;
  Iterator iter;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  S2PaddedCell local_90;
  
  if (((edges->
       super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
       )._M_impl.super__Vector_impl_data._M_start ==
       (edges->
       super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
       )._M_impl.super__Vector_impl_data._M_finish) &&
     ((tracker->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (tracker->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&iter,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
               ,0x3fe,kFatal,(ostream *)&std::cerr);
    std::operator<<((ostream *)iter.super_IteratorBase.id_.id_,
                    "Check failed: !edges->empty() || !tracker->shape_ids().empty() ");
LAB_001dc11e:
    abort();
  }
  if (disjoint_from_index) {
LAB_001dbcea:
    bVar3 = false;
LAB_001dbcec:
    bVar4 = MakeIndexCell(this,pcell,edges,tracker);
    if (bVar4) goto joined_r0x001dbd0b;
    local_10c = true;
  }
  else {
    iter.super_IteratorBase.id_.id_ = 0xffffffffffffffff;
    iter.super_IteratorBase.cell_._M_b._M_p = (__base_type)(__pointer_type)0x0;
    iter.super_IteratorBase._vptr_IteratorBase = (_func_int **)&PTR__IteratorBase_00304188;
    iter.index_ = (MutableS2ShapeIndex *)0x0;
    iter.iter_.node =
         (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
          *)0x0;
    iter.iter_.position = -1;
    iter.end_.node =
         (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
          *)0x0;
    iter.end_.position = -1;
    Iterator::InitStale(&iter,this,UNPOSITIONED);
    CVar5 = S2ShapeIndex::IteratorBase::LocateImpl<MutableS2ShapeIndex::Iterator>
                      ((S2CellId)(pcell->id_).id_,&iter);
    if (CVar5 == INDEXED) {
      bVar3 = true;
      AbsorbIndexCell(this,pcell,&iter,edges,tracker,alloc);
      goto LAB_001dbcec;
    }
    if (CVar5 == DISJOINT) goto LAB_001dbcea;
    if (CVar5 != SUBDIVIDED) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
                 ,0x428,kFatal,(ostream *)&std::cerr);
      std::operator<<((ostream *)local_90.padding_,"Check failed: (SUBDIVIDED) == (r) ");
      goto LAB_001dc11e;
    }
    local_10c = false;
    bVar3 = false;
  }
  pIVar10 = &iter;
  local_a8 = 0;
  uStack_a0 = 0;
  uStack_b0 = 0;
  iter.end_.node =
       (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
        *)0x0;
  iter.end_.position = 0;
  iter.end_._12_4_ = 0;
  iter.iter_.node =
       (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
        *)0x0;
  iter.iter_.position = 0;
  iter.iter_._12_4_ = 0;
  iter.super_IteratorBase.cell_._M_b._M_p = (__base_type)(__pointer_type)0x0;
  iter.index_ = (MutableS2ShapeIndex *)0x0;
  iter.super_IteratorBase._vptr_IteratorBase = (_func_int **)0x0;
  iter.super_IteratorBase.id_.id_ = 0;
  uVar11 = (ulong)((long)(edges->
                         super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(edges->
                        super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                        )._M_impl.super__Vector_impl_data._M_start) >> 3;
  iVar9 = (int)uVar11;
  for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
    for (lVar14 = 0; lVar14 != 0x30; lVar14 = lVar14 + 0x18) {
      std::
      vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
      ::reserve((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                 *)((long)&(pIVar10->super_IteratorBase)._vptr_IteratorBase + lVar14),(long)iVar9);
    }
    pIVar10 = (Iterator *)&pIVar10->end_;
  }
  sVar2 = alloc->size_;
  pRVar6 = S2PaddedCell::middle(pcell);
  middle = pRVar6->bounds_ + 1;
  uVar12 = 0;
  uVar11 = uVar11 & 0xffffffff;
  if (iVar9 < 1) {
    uVar11 = uVar12;
  }
  for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
    pCVar8 = (edges->
             super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
             )._M_impl.super__Vector_impl_data._M_start[uVar12];
    pIVar10 = &iter;
    if ((pCVar8->bound).bounds_[0].bounds_.c_[1] <= pRVar6->bounds_[0].bounds_.c_[0]) {
LAB_001dbeb3:
      ClipVAxis(pCVar8,middle,
                (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                 *)pIVar10,alloc);
    }
    else {
      u = pRVar6->bounds_[0].bounds_.c_[1];
      pIVar10 = (Iterator *)&iter.end_;
      if (u <= (pCVar8->bound).bounds_[0].bounds_.c_[0]) goto LAB_001dbeb3;
      if ((pCVar8->bound).bounds_[1].bounds_.c_[1] <= (middle->bounds_).c_[0]) {
        local_90.id_.id_ = (uint64)ClipUBound(pCVar8,1,u,alloc);
        std::
        vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
        ::emplace_back<MutableS2ShapeIndex::ClippedEdge_const*>
                  ((vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
                    *)&iter,(ClippedEdge **)&local_90);
        local_90.id_.id_ = (uint64)ClipUBound(pCVar8,0,pRVar6->bounds_[0].bounds_.c_[0],alloc);
        std::
        vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
        ::emplace_back<MutableS2ShapeIndex::ClippedEdge_const*>
                  ((vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
                    *)&iter.end_,(ClippedEdge **)&local_90);
      }
      else if (pRVar6->bounds_[1].bounds_.c_[1] <= (pCVar8->bound).bounds_[1].bounds_.c_[0]) {
        local_90.id_.id_ = (uint64)ClipUBound(pCVar8,1,u,alloc);
        std::
        vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
        ::emplace_back<MutableS2ShapeIndex::ClippedEdge_const*>
                  ((vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
                    *)&iter.index_,(ClippedEdge **)&local_90);
        local_90.id_.id_ = (uint64)ClipUBound(pCVar8,0,pRVar6->bounds_[0].bounds_.c_[0],alloc);
        std::
        vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
        ::emplace_back<MutableS2ShapeIndex::ClippedEdge_const*>
                  ((vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
                    *)&uStack_b0,(ClippedEdge **)&local_90);
      }
      else {
        pCVar7 = ClipUBound(pCVar8,1,u,alloc);
        ClipVAxis(pCVar7,middle,
                  (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                   *)&iter,alloc);
        pCVar8 = ClipUBound(pCVar8,0,pRVar6->bounds_[0].bounds_.c_[0],alloc);
        ClipVAxis(pCVar8,middle,
                  (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                   *)&iter.end_,alloc);
      }
    }
  }
  pIVar10 = &iter;
  for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
    for (lVar14 = 0; lVar14 != 0x30; lVar14 = lVar14 + 0x18) {
      pCVar8 = *(ClippedEdge **)((long)&(pIVar10->super_IteratorBase)._vptr_IteratorBase + lVar14);
      pCVar7 = *(ClippedEdge **)((long)&(pIVar10->super_IteratorBase).id_.id_ + lVar14);
      if (pCVar8 == pCVar7) {
        puVar1 = (undefined8 *)((long)&(pIVar10->super_IteratorBase)._vptr_IteratorBase + lVar14);
        local_90.id_.id_ = (uint64)pCVar8;
        local_90.padding_ = (double)pCVar7;
        local_90.bound_.bounds_[0].bounds_.c_[0] =
             *(VType *)((long)&(pIVar10->super_IteratorBase).cell_._M_b._M_p + lVar14);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1[2] = 0;
        std::
        _Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
        ::~_Vector_base((_Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                         *)&local_90);
      }
    }
    pIVar10 = (Iterator *)&pIVar10->end_;
  }
  for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
    iVar9 = (int)*(uint *)(S2::internal::kPosToIJ + lVar13 * 4 + (long)pcell->orientation_ * 0x10)
            >> 1;
    j = *(uint *)(S2::internal::kPosToIJ + lVar13 * 4 + (long)pcell->orientation_ * 0x10) & 1;
    if (((&iter.super_IteratorBase)[(long)iVar9 * 2 + (ulong)j]._vptr_IteratorBase !=
         (_func_int **)(&iter.super_IteratorBase)[(long)iVar9 * 2 + (ulong)j].id_.id_) ||
       ((tracker->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (tracker->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      S2PaddedCell::S2PaddedCell(&local_90,pcell,iVar9,j);
      UpdateEdges(this,&local_90,
                  (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                   *)(&iter.super_IteratorBase + (long)iVar9 * 2 + (ulong)j),tracker,alloc,local_10c
                 );
    }
  }
  alloc->size_ = sVar2;
  lVar13 = 0x48;
  do {
    std::
    _Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
    ::~_Vector_base((_Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                     *)((long)&iter.super_IteratorBase._vptr_IteratorBase + lVar13));
    lVar13 = lVar13 + -0x18;
  } while (lVar13 != -0x18);
joined_r0x001dbd0b:
  if (bVar3) {
    InteriorTracker::RestoreStateBefore(tracker,this->pending_additions_begin_);
  }
  return;
}

Assistant:

void MutableS2ShapeIndex::UpdateEdges(const S2PaddedCell& pcell,
                                      vector<const ClippedEdge*>* edges,
                                      InteriorTracker* tracker,
                                      EdgeAllocator* alloc,
                                      bool disjoint_from_index) {
  // Cases where an index cell is not needed should be detected before this.
  S2_DCHECK(!edges->empty() || !tracker->shape_ids().empty());

  // This function is recursive with a maximum recursion depth of 30
  // (S2CellId::kMaxLevel).  Note that using an explicit stack does not seem
  // to be any faster based on profiling.

  // Incremental updates are handled as follows.  All edges being added or
  // removed are combined together in "edges", and all shapes with interiors
  // are tracked using "tracker".  We subdivide recursively as usual until we
  // encounter an existing index cell.  At this point we "absorb" the index
  // cell as follows:
  //
  //   - Edges and shapes that are being removed are deleted from "edges" and
  //     "tracker".
  //   - All remaining edges and shapes from the index cell are added to
  //     "edges" and "tracker".
  //   - Continue subdividing recursively, creating new index cells as needed.
  //   - When the recursion gets back to the cell that was absorbed, we
  //     restore "edges" and "tracker" to their previous state.
  //
  // Note that the only reason that we include removed shapes in the recursive
  // subdivision process is so that we can find all of the index cells that
  // contain those shapes efficiently, without maintaining an explicit list of
  // index cells for each shape (which would be expensive in terms of memory).
  bool index_cell_absorbed = false;
  if (!disjoint_from_index) {
    // There may be existing index cells contained inside "pcell".  If we
    // encounter such a cell, we need to combine the edges being updated with
    // the existing cell contents by "absorbing" the cell.
    // Use InitStale() to avoid applying updated recursively.
    Iterator iter;
    iter.InitStale(this);
    CellRelation r = iter.Locate(pcell.id());
    if (r == DISJOINT) {
      disjoint_from_index = true;
    } else if (r == INDEXED) {
      // Absorb the index cell by transferring its contents to "edges" and
      // deleting it.  We also start tracking the interior of any new shapes.
      AbsorbIndexCell(pcell, iter, edges, tracker, alloc);
      index_cell_absorbed = true;
      disjoint_from_index = true;
    } else {
      S2_DCHECK_EQ(SUBDIVIDED, r);
    }
  }

  // If there are existing index cells below us, then we need to keep
  // subdividing so that we can merge with those cells.  Otherwise,
  // MakeIndexCell checks if the number of edges is small enough, and creates
  // an index cell if possible (returning true when it does so).
  if (!disjoint_from_index || !MakeIndexCell(pcell, *edges, tracker)) {
    // Reserve space for the edges that will be passed to each child.  This is
    // important since otherwise the running time is dominated by the time
    // required to grow the vectors.  The amount of memory involved is
    // relatively small, so we simply reserve the maximum space for every child.
    vector<const ClippedEdge*> child_edges[2][2];  // [i][j]
    int num_edges = edges->size();
    for (int i = 0; i < 2; ++i) {
      for (int j = 0; j < 2; ++j) {
        child_edges[i][j].reserve(num_edges);
      }
    }

    // Remember the current size of the EdgeAllocator so that we can free any
    // edges that are allocated during edge splitting.
    size_t alloc_size = alloc->size();

    // Compute the middle of the padded cell, defined as the rectangle in
    // (u,v)-space that belongs to all four (padded) children.  By comparing
    // against the four boundaries of "middle" we can determine which children
    // each edge needs to be propagated to.
    const R2Rect& middle = pcell.middle();

    // Build up a vector edges to be passed to each child cell.  The (i,j)
    // directions are left (i=0), right (i=1), lower (j=0), and upper (j=1).
    // Note that the vast majority of edges are propagated to a single child.
    // This case is very fast, consisting of between 2 and 4 floating-point
    // comparisons and copying one pointer.  (ClipVAxis is inline.)
    for (int e = 0; e < num_edges; ++e) {
      const ClippedEdge* edge = (*edges)[e];
      if (edge->bound[0].hi() <= middle[0].lo()) {
        // Edge is entirely contained in the two left children.
        ClipVAxis(edge, middle[1], child_edges[0], alloc);
      } else if (edge->bound[0].lo() >= middle[0].hi()) {
        // Edge is entirely contained in the two right children.
        ClipVAxis(edge, middle[1], child_edges[1], alloc);
      } else if (edge->bound[1].hi() <= middle[1].lo()) {
        // Edge is entirely contained in the two lower children.
        child_edges[0][0].push_back(ClipUBound(edge, 1, middle[0].hi(), alloc));
        child_edges[1][0].push_back(ClipUBound(edge, 0, middle[0].lo(), alloc));
      } else if (edge->bound[1].lo() >= middle[1].hi()) {
        // Edge is entirely contained in the two upper children.
        child_edges[0][1].push_back(ClipUBound(edge, 1, middle[0].hi(), alloc));
        child_edges[1][1].push_back(ClipUBound(edge, 0, middle[0].lo(), alloc));
      } else {
        // The edge bound spans all four children.  The edge itself intersects
        // either three or four (padded) children.
        const ClippedEdge* left = ClipUBound(edge, 1, middle[0].hi(), alloc);
        ClipVAxis(left, middle[1], child_edges[0], alloc);
        const ClippedEdge* right = ClipUBound(edge, 0, middle[0].lo(), alloc);
        ClipVAxis(right, middle[1], child_edges[1], alloc);
      }
    }
    // Free any memory reserved for children that turned out to be empty.  This
    // step is cheap and reduces peak memory usage by about 10% when building
    // large indexes (> 10M edges).
    for (int i = 0; i < 2; ++i) {
      for (int j = 0; j < 2; ++j) {
        if (child_edges[i][j].empty()) {
          vector<const ClippedEdge*>().swap(child_edges[i][j]);
        }
      }
    }
    // Now recursively update the edges in each child.  We call the children in
    // increasing order of S2CellId so that when the index is first constructed,
    // all insertions into cell_map_ are at the end (which is much faster).
    for (int pos = 0; pos < 4; ++pos) {
      int i, j;
      pcell.GetChildIJ(pos, &i, &j);
      if (!child_edges[i][j].empty() || !tracker->shape_ids().empty()) {
        UpdateEdges(S2PaddedCell(pcell, i, j), &child_edges[i][j],
                    tracker, alloc, disjoint_from_index);
      }
    }
    // Free any temporary edges that were allocated during clipping.
    alloc->Reset(alloc_size);
  }
  if (index_cell_absorbed) {
    // Restore the state for any edges being removed that we are tracking.
    tracker->RestoreStateBefore(pending_additions_begin_);
  }
}